

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dscal.c
# Opt level: O3

int dscal_(int *n,double *sa,double *sx,int *incx)

{
  double dVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  long lVar6;
  long lVar7;
  
  lVar6 = (long)*n;
  iVar2 = *incx;
  if (0 < iVar2 && 0 < lVar6) {
    dVar1 = *sa;
    if (iVar2 == 1) {
      if ((uint)*n < 5) {
        lVar7 = 0;
      }
      else {
        lVar7 = 0;
        do {
          dVar3 = (sx + lVar7)[1];
          dVar4 = sx[lVar7 + 2];
          dVar5 = (sx + lVar7 + 2)[1];
          sx[lVar7] = sx[lVar7] * dVar1;
          (sx + lVar7)[1] = dVar3 * dVar1;
          sx[lVar7 + 2] = dVar4 * dVar1;
          (sx + lVar7 + 2)[1] = dVar5 * dVar1;
          sx[lVar7 + 4] = sx[lVar7 + 4] * dVar1;
          lVar7 = lVar7 + 5;
        } while (lVar7 < lVar6 + -4);
      }
      if (lVar7 < lVar6) {
        do {
          sx[lVar7] = sx[lVar7] * dVar1;
          lVar7 = lVar7 + 1;
        } while (lVar6 != lVar7);
      }
    }
    else {
      lVar7 = 0;
      do {
        sx[lVar7] = sx[lVar7] * dVar1;
        lVar7 = lVar7 + iVar2;
      } while (lVar7 < lVar6 * iVar2);
    }
  }
  return 0;
}

Assistant:

int dscal_(int *n, double *sa, double *sx, int *incx)
{
  long int i, m, nincx, nn, iincx;
  double ssa;

  /* scales a vector by a constant.   
     uses unrolled loops for increment equal to 1.   
     jack dongarra, linpack, 3/11/78.   
     modified 3/93 to return if incx .le. 0.   
     modified 12/3/93, array(1) declarations changed to array(*) */

  /* Dereference inputs */
  nn = *n;
  iincx = *incx;
  ssa = *sa;

  if (nn > 0 && iincx > 0)
  {
    if (iincx == 1) /* code for increment equal to 1 */
    {
      m = nn-4;
      for (i = 0; i < m; i += 5)
      {
        sx[i] = ssa * sx[i];
        sx[i+1] = ssa * sx[i+1];
        sx[i+2] = ssa * sx[i+2];
        sx[i+3] = ssa * sx[i+3];
        sx[i+4] = ssa * sx[i+4];
      }
      for ( ; i < nn; ++i) /* clean-up loop */
        sx[i] = ssa * sx[i];
    }
    else /* code for increment not equal to 1 */
    {
      nincx = nn * iincx;
      for (i = 0; i < nincx; i += iincx)
        sx[i] = ssa * sx[i];
    }
  }

  return 0;
}